

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototype(DynamicMessageFactory *this,Descriptor *type)

{
  Message *pMVar1;
  undefined8 extraout_RAX;
  
  if (type != (Descriptor *)0x0) {
    absl::lts_20250127::Mutex::Lock(&this->prototypes_mutex_);
    pMVar1 = GetPrototypeNoLock(this,type);
    absl::lts_20250127::Mutex::Unlock(&this->prototypes_mutex_);
    return pMVar1;
  }
  GetPrototype((DynamicMessageFactory *)&stack0xffffffffffffffd8);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

const Message* PROTOBUF_NONNULL
DynamicMessageFactory::GetPrototype(const Descriptor* PROTOBUF_NONNULL type) {
  ABSL_CHECK(type != nullptr);
  absl::MutexLock lock(&prototypes_mutex_);
  return GetPrototypeNoLock(type);
}